

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O0

void slang::signExtend(uint64_t *input,uint32_t numWords,uint32_t word,uint32_t bit,
                      uint64_t topWordMask)

{
  uint32_t i;
  uint64_t mask;
  uint64_t topWordMask_local;
  uint32_t bit_local;
  uint32_t word_local;
  uint32_t numWords_local;
  uint64_t *input_local;
  
  if ((input[word] & 1L << ((byte)bit & 0x3f)) != 0) {
    i = numWords;
    numWords_local = numWords;
    topWordMask_local = topWordMask;
    if (word < numWords - 1) {
      input[numWords - 1] = topWordMask;
      i = numWords - 1;
      topWordMask_local = 0xffffffffffffffff;
      numWords_local = i;
    }
    while (i = i - 1, word < i) {
      input[i] = 0xffffffffffffffff;
    }
    mask = -1L << ((byte)bit & 0x3f);
    if (numWords_local - 1 == word) {
      mask = topWordMask_local & mask;
    }
    input[word] = mask | input[word];
  }
  return;
}

Assistant:

static void signExtend(uint64_t* input, uint32_t numWords, uint32_t word, uint32_t bit,
                       uint64_t topWordMask) {
    if ((input[word] & (1ULL << bit)) == 0)
        return; // If word.bit is zero, don't change anything.

    if (numWords - 1 > word) {
        input[numWords - 1] = topWordMask;
        numWords--;
        topWordMask = UINT64_MAX;
    }

    uint64_t mask = UINT64_MAX;
    for (auto i = numWords - 1; i > word; i--)
        input[i] = mask;

    mask <<= bit;
    if (numWords - 1 == word)
        mask &= topWordMask;
    input[word] |= mask;
}